

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int parse_rockridge(archive_read *a,file_info *file,uchar *p,uchar *end)

{
  ulong *puVar1;
  archive_string *as;
  archive_string *as_00;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  void *pvVar5;
  void *pvVar6;
  void *__src;
  long lVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  void *__dest;
  time_t tVar12;
  ulong *puVar13;
  char *pcVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  long lVar19;
  byte *pbVar20;
  uint *p_00;
  uint uVar21;
  
  p_00 = (uint *)(p + 4);
  if ((end < p_00) || (bVar18 = *p, 0x19 < (byte)(bVar18 + 0xbf))) {
LAB_006f3d33:
    archive_set_error(&a->archive,0x54,"Tried to parse Rockridge extensions, but none found");
    iVar16 = -0x14;
  }
  else {
    pvVar5 = a->format->data;
    as = &file->symlink;
    as_00 = &file->name;
    bVar8 = true;
    do {
      bVar2 = p[1];
      if (0x19 < (byte)(bVar2 + 0xbf)) {
LAB_006f3d2f:
        if (!bVar8) {
          return 0;
        }
        goto LAB_006f3d33;
      }
      bVar3 = p[2];
      if (((ulong)bVar3 < 4) || (end < p + bVar3)) goto LAB_006f3d2f;
      uVar9 = bVar3 - 4;
      bVar4 = p[3];
      if (0xc < bVar18 - 0x4e) {
        if (bVar18 == 0x43) {
          if (bVar2 == 0x4c) {
            if (uVar9 == 8 && bVar4 == 1) {
              file->cl_offset = (ulong)*p_00 * *(long *)((long)pvVar5 + 0xa8);
              goto switchD_006f35be_caseD_3;
            }
          }
          else if ((bVar2 == 0x45) && (uVar9 == 0x18 && bVar4 == 1)) {
            uVar9 = *p_00;
            uVar10 = *(uint *)(p + 0xc);
            file->ce_offset = uVar10;
            uVar21 = *(uint *)(p + 0x14);
            file->ce_size = uVar21;
            pvVar6 = a->format->data;
            uVar17 = (long)(int)uVar9 * *(ulong *)((long)pvVar6 + 0xa8);
            if ((((file->mode & 0xf000) == 0x8000) && (file->offset <= uVar17)) ||
               (((uVar17 < *(ulong *)((long)pvVar6 + 0xa0) ||
                 (uVar11 = (ulong)uVar21 + (ulong)uVar10, *(ulong *)((long)pvVar6 + 0xa8) < uVar11))
                || (*(ulong *)((long)pvVar6 + 0xb0) < uVar11 + uVar17)))) {
              pcVar14 = "Invalid parameter in SUSP \"CE\" extension";
              iVar16 = -1;
LAB_006f3d89:
              archive_set_error(&a->archive,iVar16,pcVar14);
              return -0x1e;
            }
            uVar9 = *(uint *)((long)pvVar6 + 0x40);
            uVar11 = (ulong)uVar9;
            iVar16 = *(int *)((long)pvVar6 + 0x44);
            if (iVar16 <= (int)uVar9) {
              uVar10 = iVar16 * 2;
              if (iVar16 < 0x10) {
                uVar10 = 0x10;
              }
              if (((int)uVar10 <= iVar16) ||
                 (__dest = calloc((ulong)uVar10,0x10), __dest == (void *)0x0)) {
                pcVar14 = "Out of memory";
                iVar16 = 0xc;
                goto LAB_006f3d89;
              }
              __src = *(void **)((long)pvVar6 + 0x38);
              if (__src != (void *)0x0) {
                memcpy(__dest,__src,(long)(int)uVar9 << 4);
                free(__src);
                uVar11 = (ulong)*(uint *)((long)pvVar6 + 0x40);
              }
              *(void **)((long)pvVar6 + 0x38) = __dest;
              *(uint *)((long)pvVar6 + 0x44) = uVar10;
            }
            *(int *)((long)pvVar6 + 0x40) = (int)uVar11 + 1;
            if (0 < (int)uVar11) {
              do {
                uVar9 = (int)uVar11 - 1;
                uVar15 = (ulong)(uVar9 >> 1);
                lVar7 = *(long *)((long)pvVar6 + 0x38);
                lVar19 = uVar15 * 0x10;
                puVar1 = (ulong *)(lVar7 + uVar11 * 0x10);
                if (*(ulong *)(lVar7 + lVar19) <= uVar17) {
                  *puVar1 = uVar17;
                  *(file_info **)(lVar7 + 8 + uVar11 * 0x10) = file;
                  goto switchD_006f3569_caseD_4f;
                }
                puVar13 = (ulong *)(lVar7 + lVar19);
                uVar11 = puVar13[1];
                *puVar1 = *puVar13;
                puVar1[1] = uVar11;
                uVar11 = uVar15;
              } while (1 < uVar9);
            }
            puVar1 = *(ulong **)((long)pvVar6 + 0x38);
            *puVar1 = uVar17;
            puVar1[1] = (ulong)file;
          }
        }
        goto switchD_006f3569_caseD_4f;
      }
      uVar10 = (uint)bVar3;
      switch((uint)bVar18) {
      case 0x4e:
        if (bVar4 != 1 || bVar2 != 0x4d) break;
        if (file->name_continues == '\0') {
          (file->name).length = 0;
        }
        file->name_continues = '\0';
        if (bVar3 < 5) goto switchD_006f35be_caseD_3;
        switch((byte)*p_00) {
        case 0:
          if (uVar9 != 1) {
            archive_strncat(as_00,p + 5,(ulong)(uVar10 - 5));
          }
          break;
        case 1:
          if (uVar9 != 1) {
            archive_strncat(as_00,p + 5,(ulong)(uVar10 - 5));
            file->name_continues = '\x01';
          }
          break;
        case 2:
          pcVar14 = ".";
          goto LAB_006f3cde;
        case 4:
          pcVar14 = "..";
LAB_006f3cde:
          archive_strcat(as_00,pcVar14);
        }
switchD_006f35be_caseD_3:
        *(undefined1 *)((long)pvVar5 + 0x28) = 1;
        break;
      case 0x50:
        if (bVar2 == 0x4e) {
          if (uVar9 == 0x10 && bVar4 == 1) {
            uVar9 = toi(p_00,4);
            file->rdev = (ulong)uVar9 << 0x20;
            uVar10 = toi(p + 0xc,4);
            file->rdev = CONCAT44(uVar9,uVar10);
            *(undefined1 *)((long)pvVar5 + 0x28) = 1;
          }
        }
        else if (bVar4 == 1 && bVar2 == 0x58) {
          if (0xb < bVar3) {
            uVar9 = toi(p_00,4);
            file->mode = uVar9;
            if (0x13 < bVar3) {
              uVar9 = toi(p + 0xc,4);
              file->nlinks = uVar9;
              if (0x1b < bVar3) {
                uVar9 = toi(p + 0x14,4);
                file->uid = uVar9;
                if (0x23 < bVar3) {
                  uVar9 = toi(p + 0x1c,4);
                  file->gid = uVar9;
                  if (0x2b < bVar3) {
                    uVar9 = toi(p + 0x24,4);
                    file->number = (ulong)uVar9;
                  }
                }
              }
            }
          }
          goto switchD_006f35be_caseD_3;
        }
        break;
      case 0x52:
        if (bVar4 == 1 && bVar2 == 0x45) {
          file->re = '\x01';
          *(undefined1 *)((long)pvVar5 + 0x28) = 1;
        }
        break;
      case 0x53:
        if (bVar2 == 0x4c) {
          if (bVar4 == 1) {
            if ((file->symlink_continues == '\0') || ((file->symlink).length == 0)) {
              (file->symlink).length = 0;
            }
            file->symlink_continues = '\0';
            if (4 < bVar3) {
              if ((byte)*p_00 != 0) {
                if ((byte)*p_00 != 1) goto switchD_006f3899_caseD_3;
                file->symlink_continues = '\x01';
              }
              if (2 < uVar9) {
                iVar16 = uVar10 - 5;
                pbVar20 = p + 5;
                pcVar14 = "";
                do {
                  bVar18 = *pbVar20;
                  bVar2 = pbVar20[1];
                  pbVar20 = pbVar20 + 2;
                  uVar9 = iVar16 - 2;
                  archive_strcat(as,pcVar14);
                  switch(bVar18) {
                  case 0:
                    if (bVar2 <= uVar9) {
                      archive_strncat(as,pbVar20,(ulong)(uint)bVar2);
                      goto LAB_006f38f9;
                    }
                    goto switchD_006f3899_caseD_3;
                  case 1:
                    if (uVar9 < bVar2) goto switchD_006f3899_caseD_3;
                    archive_strncat(as,pbVar20,(ulong)bVar2);
                    break;
                  case 2:
                    pcVar14 = ".";
                    goto LAB_006f38f4;
                  case 3:
                  case 5:
                  case 6:
                  case 7:
                    goto switchD_006f3899_caseD_3;
                  case 4:
                    pcVar14 = "..";
LAB_006f38f4:
                    archive_strcat(as,pcVar14);
LAB_006f38f9:
                    pcVar14 = "/";
                    goto LAB_006f395c;
                  case 8:
                    archive_strcat(as,"/");
                    break;
                  default:
                    if (bVar18 == 0x10) {
                      (file->symlink).length = 0;
                      archive_strcat(as,"ROOT");
                      pcVar14 = "/";
                      goto LAB_006f395c;
                    }
                    if (bVar18 == 0x20) {
                      pcVar14 = "hostname";
                      goto LAB_006f38f4;
                    }
                    goto switchD_006f3899_caseD_3;
                  }
                  pcVar14 = "";
LAB_006f395c:
                  pbVar20 = pbVar20 + bVar2;
                  iVar16 = uVar9 - bVar2;
                } while (1 < iVar16);
              }
            }
switchD_006f3899_caseD_3:
            *(undefined1 *)((long)pvVar5 + 0x28) = 1;
          }
        }
        else if (((bVar2 == 0x54) && (bVar3 == 4)) && (bVar4 == 1)) {
          *(undefined2 *)((long)pvVar5 + 0x28) = 0;
          return 0;
        }
        break;
      case 0x54:
        if (bVar4 == 1 && bVar2 == 0x46) {
          if (4 < bVar3) {
            bVar18 = (byte)*p_00;
            pbVar20 = p + 5;
            uVar21 = bVar3 - 5;
            if ((char)bVar18 < '\0') {
              if ((0x11 < uVar9) && ((bVar18 & 1) != 0)) {
                file->birthtime_is_set = 1;
                tVar12 = isodate17(pbVar20);
                file->birthtime = tVar12;
                pbVar20 = p + 0x16;
                uVar21 = uVar10 - 0x16;
              }
              if (((bVar18 & 2) != 0) && (0x10 < uVar21)) {
                tVar12 = isodate17(pbVar20);
                file->mtime = tVar12;
                pbVar20 = pbVar20 + 0x11;
                uVar21 = uVar21 - 0x11;
              }
              if (((bVar18 & 4) != 0) && (0x10 < uVar21)) {
                tVar12 = isodate17(pbVar20);
                file->atime = tVar12;
                pbVar20 = pbVar20 + 0x11;
                uVar21 = uVar21 - 0x11;
              }
              if (((bVar18 & 8) != 0) && (0x10 < uVar21)) {
                tVar12 = isodate17(pbVar20);
                goto LAB_006f3c86;
              }
            }
            else {
              if ((7 < uVar9) && ((bVar18 & 1) != 0)) {
                file->birthtime_is_set = 1;
                tVar12 = isodate7(pbVar20);
                file->birthtime = tVar12;
                pbVar20 = p + 0xc;
                uVar21 = uVar10 - 0xc;
              }
              if (((bVar18 & 2) != 0) && (6 < uVar21)) {
                tVar12 = isodate7(pbVar20);
                file->mtime = tVar12;
                pbVar20 = pbVar20 + 7;
                uVar21 = uVar21 - 7;
              }
              if (((bVar18 & 4) != 0) && (6 < uVar21)) {
                tVar12 = isodate7(pbVar20);
                file->atime = tVar12;
                pbVar20 = pbVar20 + 7;
                uVar21 = uVar21 - 7;
              }
              if (((bVar18 & 8) != 0) && (6 < uVar21)) {
                tVar12 = isodate7(pbVar20);
LAB_006f3c86:
                file->ctime = tVar12;
              }
            }
          }
          goto switchD_006f35be_caseD_3;
        }
        break;
      case 0x5a:
        if (((bVar4 == 1 && bVar2 == 0x46) && ((byte)*p_00 == 0x70)) &&
           ((uVar9 == 0xc && (p[5] == 0x7a)))) {
          file->pz = 1;
          file->pz_log2_bs = (uint)p[7];
          file->pz_uncompressed_size = (ulong)*(uint *)(p + 8);
        }
      }
switchD_006f3569_caseD_4f:
      p_00 = (uint *)(p + (ulong)p[2] + 4);
      if (end < p_00) {
        return 0;
      }
      p = p + p[2];
      bVar18 = *p;
      bVar8 = false;
      iVar16 = 0;
    } while ((byte)(bVar18 + 0xbf) < 0x1a);
  }
  return iVar16;
}

Assistant:

static int
parse_rockridge(struct archive_read *a, struct file_info *file,
    const unsigned char *p, const unsigned char *end)
{
	struct iso9660 *iso9660;
	int entry_seen = 0;

	iso9660 = (struct iso9660 *)(a->format->data);

	while (p + 4 <= end  /* Enough space for another entry. */
	    && p[0] >= 'A' && p[0] <= 'Z' /* Sanity-check 1st char of name. */
	    && p[1] >= 'A' && p[1] <= 'Z' /* Sanity-check 2nd char of name. */
	    && p[2] >= 4 /* Sanity-check length. */
	    && p + p[2] <= end) { /* Sanity-check length. */
		const unsigned char *data = p + 4;
		int data_length = p[2] - 4;
		int version = p[3];

		switch(p[0]) {
		case 'C':
			if (p[1] == 'E') {
				if (version == 1 && data_length == 24) {
					/*
					 * CE extension comprises:
					 *   8 byte sector containing extension
					 *   8 byte offset w/in above sector
					 *   8 byte length of continuation
					 */
					int32_t location =
					    archive_le32dec(data);
					file->ce_offset =
					    archive_le32dec(data+8);
					file->ce_size =
					    archive_le32dec(data+16);
					if (register_CE(a, location, file)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
			}
			else if (p[1] == 'L') {
				if (version == 1 && data_length == 8) {
					file->cl_offset = (uint64_t)
					    iso9660->logical_block_size *
					    (uint64_t)archive_le32dec(data);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'N':
			if (p[1] == 'M') {
				if (version == 1) {
					parse_rockridge_NM1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'P':
			/*
			 * PD extension is padding;
			 * contents are always ignored.
			 *
			 * PL extension won't appear;
			 * contents are always ignored.
			 */
			if (p[1] == 'N') {
				if (version == 1 && data_length == 16) {
					file->rdev = toi(data,4);
					file->rdev <<= 32;
					file->rdev |= toi(data + 8, 4);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'X') {
				/*
				 * PX extension comprises:
				 *   8 bytes for mode,
				 *   8 bytes for nlinks,
				 *   8 bytes for uid,
				 *   8 bytes for gid,
				 *   8 bytes for inode.
				 */
				if (version == 1) {
					if (data_length >= 8)
						file->mode
						    = toi(data, 4);
					if (data_length >= 16)
						file->nlinks
						    = toi(data + 8, 4);
					if (data_length >= 24)
						file->uid
						    = toi(data + 16, 4);
					if (data_length >= 32)
						file->gid
						    = toi(data + 24, 4);
					if (data_length >= 40)
						file->number
						    = toi(data + 32, 4);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'R':
			if (p[1] == 'E' && version == 1) {
				file->re = 1;
				iso9660->seenRockridge = 1;
			}
			else if (p[1] == 'R' && version == 1) {
				/*
				 * RR extension comprises:
				 *    one byte flag value
				 * This extension is obsolete,
				 * so contents are always ignored.
				 */
			}
			break;
		case 'S':
			if (p[1] == 'L') {
				if (version == 1) {
					parse_rockridge_SL1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'T'
			    && data_length == 0 && version == 1) {
				/*
				 * ST extension marks end of this
				 * block of SUSP entries.
				 *
				 * It allows SUSP to coexist with
				 * non-SUSP uses of the System
				 * Use Area by placing non-SUSP data
				 * after SUSP data.
				 */
				iso9660->seenSUSP = 0;
				iso9660->seenRockridge = 0;
				return (ARCHIVE_OK);
			}
			break;
		case 'T':
			if (p[1] == 'F') {
				if (version == 1) {
					parse_rockridge_TF1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'Z':
			if (p[1] == 'F') {
				if (version == 1)
					parse_rockridge_ZF1(file,
					    data, data_length);
			}
			break;
		default:
			break;
		}

		p += p[2];
		entry_seen = 1;
	}

	if (entry_seen)
		return (ARCHIVE_OK);
	else {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "Tried to parse Rockridge extensions, but none found");
		return (ARCHIVE_WARN);
	}
}